

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O2

errno_t wcscpy_s(WCHAR *_Dst,size_t _SizeInWords,WCHAR *_Src)

{
  long lVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  
  if (_Dst != (WCHAR *)0x0 && _SizeInWords != 0) {
    if (_Src != (WCHAR *)0x0) {
      lVar4 = -1;
      lVar3 = 0;
      do {
        sVar2 = *(short *)((long)_Src + lVar3);
        *(short *)((long)_Dst + lVar3) = sVar2;
        if (sVar2 == 0) {
          if (_SizeInWords <= (ulong)-lVar4) {
            return 0;
          }
          memset((void *)((long)_Dst + lVar3 + 2),0xfd,(_SizeInWords * 2 - lVar3) - 2);
          return 0;
        }
        lVar3 = lVar3 + 2;
        lVar1 = _SizeInWords + lVar4;
        lVar4 = lVar4 + -1;
      } while (lVar1 != 0);
      *_Dst = L'\0';
      if (1 < _SizeInWords) {
        memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
      }
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
      return 0x22;
    }
    *_Dst = L'\0';
    if (1 < _SizeInWords) {
      memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return 0x16;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl wcscpy_s(WCHAR *_Dst, size_t _SizeInWords, const WCHAR *_Src)
{
    WCHAR *p;
    size_t available;

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInWords);
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInWords);

    p = _Dst;
    available = _SizeInWords;
    while ((*p++ = *_Src++) != 0 && --available > 0)
    {
    }

    if (available == 0)
    {
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInWords);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInWords, _SizeInWords - available + 1);
    return 0;
}